

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O2

void nuts_tran_exchange(char *scheme)

{
  _Bool _Var1;
  nng_err nVar2;
  int iVar3;
  nng_err nVar4;
  char *pcVar5;
  undefined1 local_98 [8];
  char buf_ [64];
  nng_url *url;
  size_t sStack_48;
  nng_dialer d1;
  size_t sz_;
  nng_socket local_38;
  nng_listener l1;
  nng_socket s1;
  nng_socket s2;
  
  local_38.id = 0;
  l1.id = 0;
  sz_._4_4_ = 0;
  url._4_4_ = 0;
  pcVar5 = strchr(scheme,0x36);
  if (pcVar5 != (char *)0x0) {
    _Var1 = nuts_has_ipv6();
    if (!_Var1) {
      acutest_skip_("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                    ,0x17c,"No IPv6 support present");
      return;
    }
  }
  nuts_scratch_addr_zero(scheme,0x40,nuts_tran_exchange::nuts_addr_);
  nVar2 = nng_pair1_open(&local_38);
  pcVar5 = nng_strerror(nVar2);
  iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                         ,0x17e,"%s: expected success, got %s (%d)","nng_pair1_open(&(s1))",pcVar5,
                         nVar2);
  if (iVar3 != 0) {
    nVar2 = nng_pair1_open((nng_socket *)&l1);
    pcVar5 = nng_strerror(nVar2);
    iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                           ,0x17f,"%s: expected success, got %s (%d)","nng_pair1_open(&(s2))",pcVar5
                           ,nVar2);
    if (iVar3 != 0) {
      nVar2 = nng_socket_set_ms(local_38,"send-timeout",100);
      pcVar5 = nng_strerror(nVar2);
      iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                             ,0x180,"%s: expected success, got %s (%d)",
                             "nng_socket_set_ms(s1, NNG_OPT_SENDTIMEO, 100)",pcVar5,nVar2);
      if (iVar3 != 0) {
        nVar2 = nng_socket_set_ms((nng_socket)l1.id,"send-timeout",100);
        pcVar5 = nng_strerror(nVar2);
        iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                               ,0x181,"%s: expected success, got %s (%d)",
                               "nng_socket_set_ms(s2, NNG_OPT_SENDTIMEO, 100)",pcVar5,nVar2);
        if (iVar3 != 0) {
          nVar2 = nng_socket_set_ms(local_38,"recv-timeout",100);
          pcVar5 = nng_strerror(nVar2);
          iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                 ,0x182,"%s: expected success, got %s (%d)",
                                 "nng_socket_set_ms(s1, NNG_OPT_RECVTIMEO, 100)",pcVar5,nVar2);
          if (iVar3 != 0) {
            nVar2 = nng_socket_set_ms((nng_socket)l1.id,"recv-timeout",100);
            pcVar5 = nng_strerror(nVar2);
            iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                   ,0x183,"%s: expected success, got %s (%d)",
                                   "nng_socket_set_ms(s2, NNG_OPT_RECVTIMEO, 100)",pcVar5,nVar2);
            if (iVar3 != 0) {
              nVar2 = nng_listen(local_38,nuts_tran_exchange::nuts_addr_,
                                 (nng_listener *)((long)&sz_ + 4),0);
              pcVar5 = nng_strerror(nVar2);
              iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                     ,0x184,"%s: expected success, got %s (%d)",
                                     "nng_listen(s1, addr, &l1, 0)",pcVar5,nVar2);
              if (iVar3 != 0) {
                nVar2 = nng_listener_get_url(sz_._4_4_,(nng_url **)(buf_ + 0x38));
                pcVar5 = nng_strerror(nVar2);
                iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                       ,0x185,"%s: expected success, got %s (%d)",
                                       "nng_listener_get_url(l1, &url)",pcVar5,nVar2);
                if (iVar3 != 0) {
                  nVar2 = nng_dial_url((nng_socket)l1.id,(nng_url *)buf_._56_8_,
                                       (nng_dialer *)((long)&url + 4),0);
                  pcVar5 = nng_strerror(nVar2);
                  iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                         ,0x186,"%s: expected success, got %s (%d)",
                                         "nng_dial_url(s2, url, &d1, 0)",pcVar5,nVar2);
                  if (iVar3 != 0) {
                    iVar3 = nng_listener_id(sz_._4_4_);
                    acutest_check_((uint)(0 < iVar3),
                                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                   ,0x187,"%s","nng_listener_id(l1) > 0");
                    iVar3 = nng_dialer_id(url._4_4_);
                    acutest_check_((uint)(0 < iVar3),
                                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                   ,0x188,"%s","nng_dialer_id(d1) > 0");
                    iVar3 = 5;
                    while( true ) {
                      if (iVar3 == 0) break;
                      url._0_4_ = iVar3 + -1;
                      nVar2 = nng_send(local_38,"ping",5,0);
                      pcVar5 = nng_strerror(nVar2);
                      iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                             ,0x18a,"%s: expected success, got %s (%d)",
                                             "nng_send(s1, \"ping\", strlen(\"ping\") + 1, 0)",
                                             pcVar5,nVar2);
                      if (iVar3 == 0) goto LAB_0012918c;
                      sStack_48 = 0x40;
                      nVar4 = nng_recv((nng_socket)l1.id,local_98,&stack0xffffffffffffffb8,0);
                      pcVar5 = nng_strerror(nVar4);
                      acutest_check_((uint)(nVar4 == NNG_OK),
                                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                     ,0x18b,"nng_recv (%d %s)",(ulong)nVar4,pcVar5,nVar2);
                      acutest_check_((uint)(sStack_48 == 5),
                                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                     ,0x18b,"length %d want %d",sStack_48,5);
                      buf_[0x37] = '\0';
                      iVar3 = bcmp("ping",local_98,5);
                      acutest_check_((uint)(iVar3 == 0),
                                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                     ,0x18b,"%s == %s","ping",local_98);
                      nVar2 = nng_send((nng_socket)l1.id,"acknowledge",0xc,0);
                      pcVar5 = nng_strerror(nVar2);
                      iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                             ,0x18c,"%s: expected success, got %s (%d)",
                                             "nng_send(s2, \"acknowledge\", strlen(\"acknowledge\") + 1, 0)"
                                             ,pcVar5,nVar2);
                      if (iVar3 == 0) goto LAB_0012918c;
                      sStack_48 = 0x40;
                      nVar4 = nng_recv(local_38,local_98,&stack0xffffffffffffffb8,0);
                      pcVar5 = nng_strerror(nVar4);
                      acutest_check_((uint)(nVar4 == NNG_OK),
                                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                     ,0x18d,"nng_recv (%d %s)",(ulong)nVar4,pcVar5,nVar2);
                      acutest_check_((uint)(sStack_48 == 0xc),
                                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                     ,0x18d,"length %d want %d",sStack_48,0xc);
                      buf_[0x37] = '\0';
                      iVar3 = bcmp("acknowledge",local_98,0xc);
                      acutest_check_((uint)(iVar3 == 0),
                                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                     ,0x18d,"%s == %s","acknowledge",local_98);
                      iVar3 = (int)url;
                    }
                    nVar2 = nng_socket_close(local_38);
                    pcVar5 = nng_strerror(nVar2);
                    iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                           ,399,"%s: expected success, got %s (%d)",
                                           "nng_socket_close(s1)",pcVar5,nVar2);
                    if (iVar3 != 0) {
                      nVar2 = nng_socket_close((nng_socket)l1.id);
                      pcVar5 = nng_strerror(nVar2);
                      iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                             ,400,"%s: expected success, got %s (%d)",
                                             "nng_socket_close(s2)",pcVar5,nVar2);
                      if (iVar3 != 0) {
                        return;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_0012918c:
  acutest_abort_();
}

Assistant:

void
nuts_tran_exchange(const char *scheme)
{
	nng_socket     s1 = NNG_SOCKET_INITIALIZER;
	nng_socket     s2 = NNG_SOCKET_INITIALIZER;
	nng_listener   l1 = NNG_LISTENER_INITIALIZER;
	nng_dialer     d1 = NNG_LISTENER_INITIALIZER;
	const char    *addr;
	const nng_url *url;

	NUTS_SKIP_IF_IPV6_NEEDED_AND_ABSENT(scheme);
	NUTS_ADDR_ZERO(addr, scheme);
	NUTS_OPEN(s1);
	NUTS_OPEN(s2);
	NUTS_PASS(nng_socket_set_ms(s1, NNG_OPT_SENDTIMEO, 100));
	NUTS_PASS(nng_socket_set_ms(s2, NNG_OPT_SENDTIMEO, 100));
	NUTS_PASS(nng_socket_set_ms(s1, NNG_OPT_RECVTIMEO, 100));
	NUTS_PASS(nng_socket_set_ms(s2, NNG_OPT_RECVTIMEO, 100));
	NUTS_PASS(nng_listen(s1, addr, &l1, 0));
	NUTS_PASS(nng_listener_get_url(l1, &url));
	NUTS_PASS(nng_dial_url(s2, url, &d1, 0));
	NUTS_TRUE(nng_listener_id(l1) > 0);
	NUTS_TRUE(nng_dialer_id(d1) > 0);
	for (int i = 0; i < 5; i++) {
		NUTS_SEND(s1, "ping");
		NUTS_RECV(s2, "ping");
		NUTS_SEND(s2, "acknowledge");
		NUTS_RECV(s1, "acknowledge");
	}
	NUTS_CLOSE(s1);
	NUTS_CLOSE(s2);
}